

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall bloaty::RangeMapTest_Translation_Test::TestBody(RangeMapTest_Translation_Test *this)

{
  RangeMap *this_00;
  RangeMap *this_01;
  RangeMap *other;
  bool bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  pointer *__ptr_2;
  pointer *__ptr;
  long *plVar6;
  pointer *__ptr_4;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  initializer_list<bloaty::RangeMapTest::Entry> __l_02;
  initializer_list<bloaty::RangeMapTest::Entry> __l_03;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  pointer local_b0;
  undefined1 local_a0 [24];
  string local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  undefined8 local_60;
  uint64_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar5 = local_a0 + 0x10;
  local_a0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"foo","");
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddDualRange(this_00,0x14,5,0x78,(string *)local_a0);
  if ((char *)local_a0._0_8_ != pcVar5) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
  local_a0._0_8_ = (pointer)0x14;
  local_a0._8_8_ = 0x19;
  local_a0._16_8_ = 0x78;
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>(local_88,"foo","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_a0;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8,__l,(allocator_type *)&local_c8);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,this_00,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"translate me","");
  this_01 = &(this->super_RangeMapTest).map2_;
  other = &(this->super_RangeMapTest).map3_;
  pcVar4 = (char *)0x0;
  local_b8[0] = (internal)
                RangeMap::AddRangeWithTranslation
                          (this_01,0x14,5,(string *)local_a0,this_00,false,other);
  local_b0 = (pointer)0x0;
  if ((char *)local_a0._0_8_ == pcVar5) {
    bVar2 = true;
    if (!(bool)local_b8[0]) goto LAB_0017be82;
  }
  else {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    bVar2 = true;
    if (((byte)local_b8[0] & 1) == 0) {
LAB_0017be82:
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b8,
                 (AssertionResult *)
                 "map2_.AddRangeWithTranslation(20, 5, \"translate me\", map_, false, &map3_)",
                 "false","true",pcVar4);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                 ,0x13d,(char *)local_a0._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      bVar2 = false;
    }
  }
  if (local_b0 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  if (!bVar2) {
    return;
  }
  RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
  local_a0._0_8_ = (pointer)0x14;
  local_a0._8_8_ = 0x19;
  local_a0._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>(local_88,"translate me","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_a0;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8,__l_00,(allocator_type *)&local_c8);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,this_01,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  pcVar5 = local_a0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = (pointer)0x78;
  local_a0._8_8_ = 0x7d;
  local_a0._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>(local_88,"translate me","");
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_a0;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8,__l_01,(allocator_type *)&local_c8);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,other,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"bar","");
  RangeMap::AddDualRange(this_00,1000,0x1e,0x44c,(string *)local_a0);
  if ((char *)local_a0._0_8_ != pcVar5) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"translate me2","");
  pcVar4 = (char *)0x0;
  local_b8[0] = (internal)
                RangeMap::AddRangeWithTranslation
                          (this_01,1000,5,(string *)local_a0,this_00,false,other);
  local_b0 = (pointer)0x0;
  if ((char *)local_a0._0_8_ == pcVar5) {
    bVar2 = true;
    if (!(bool)local_b8[0]) goto LAB_0017c112;
  }
  else {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    bVar2 = true;
    if (((byte)local_b8[0] & 1) == 0) {
LAB_0017c112:
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b8,
                 (AssertionResult *)
                 "map2_.AddRangeWithTranslation(1000, 5, \"translate me2\", map_, false, &map3_)",
                 "false","true",pcVar4);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                 ,0x149,(char *)local_a0._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      bVar2 = false;
    }
  }
  if (local_b0 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  if (!bVar2) {
    return;
  }
  local_a0._0_8_ = (pointer)0x14;
  local_a0._8_8_ = 0x19;
  local_a0._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>(local_88,"translate me","");
  local_68 = 1000;
  local_60 = 0x3ed;
  local_58 = (this->super_RangeMapTest).kNoTranslation;
  plVar6 = local_40;
  local_50[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"translate me2","");
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_a0;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8,__l_02,(allocator_type *)&local_c8);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,this_01,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  lVar3 = -0x70;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -7;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0);
  local_a0._0_8_ = (pointer)0x78;
  local_a0._8_8_ = 0x7d;
  local_a0._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>(local_88,"translate me","");
  local_68 = 0x44c;
  local_60 = 0x451;
  local_58 = (this->super_RangeMapTest).kNoTranslation;
  plVar6 = local_40;
  local_50[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"translate me2","");
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_a0;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8,__l_03,(allocator_type *)&local_c8);
  RangeMapTest::AssertMapEquals
            (&this->super_RangeMapTest,other,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             local_b8);
  lVar3 = -0x70;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -7;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0);
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"translate me","");
  pcVar5 = (char *)0x0;
  bVar2 = RangeMap::AddRangeWithTranslation(this_01,0xf,8,(string *)local_a0,this_00,false,other);
  local_b8[0] = (internal)!bVar2;
  local_b0 = (pointer)0x0;
  if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
    bVar1 = true;
    if (bVar2) goto LAB_0017c3fb;
  }
  else {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    bVar1 = true;
    if (((byte)local_b8[0] & 1) == 0) {
LAB_0017c3fb:
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b8,
                 (AssertionResult *)
                 "map2_.AddRangeWithTranslation(15, 8, \"translate me\", map_, false, &map3_)",
                 "true","false",pcVar5);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                 ,0x155,(char *)local_a0._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      bVar1 = false;
    }
  }
  if (local_b0 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  if (!bVar1) {
    return;
  }
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"translate me","");
  pcVar5 = (char *)0x0;
  bVar2 = RangeMap::AddRangeWithTranslation(this_01,0x16,0xf,(string *)local_a0,this_00,false,other)
  ;
  local_b8[0] = (internal)!bVar2;
  local_b0 = (pointer)0x0;
  if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
    bVar1 = true;
    if (!bVar2) goto LAB_0017c5c9;
  }
  else {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    bVar1 = true;
    if (((byte)local_b8[0] & 1) != 0) goto LAB_0017c5c9;
  }
  testing::Message::Message((Message *)&local_c8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_a0,(internal *)local_b8,
             (AssertionResult *)
             "map2_.AddRangeWithTranslation(22, 15, \"translate me\", map_, false, &map3_)","true",
             "false",pcVar5);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
             ,0x159,(char *)local_a0._0_8_);
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if (local_c8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_c8._M_head_impl + 8))();
  }
  bVar1 = false;
LAB_0017c5c9:
  if (local_b0 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  if (bVar1) {
    pcVar5 = local_a0 + 0x10;
    local_a0._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"translate me","");
    pcVar4 = (char *)0x0;
    bVar2 = RangeMap::AddRangeWithTranslation
                      (this_01,0x14,1000,(string *)local_a0,this_00,false,other);
    local_b8[0] = (internal)!bVar2;
    local_b0 = (pointer)0x0;
    if ((char *)local_a0._0_8_ != pcVar5) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if (bVar2) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b8,
                 (AssertionResult *)
                 "map2_.AddRangeWithTranslation(20, 1000, \"translate me\", map_, false, &map3_)",
                 "true","false",pcVar4);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                 ,0x15d,(char *)local_a0._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((char *)local_a0._0_8_ != pcVar5) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      if (local_b0 != (pointer)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      }
    }
  }
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation) {
  map_.AddDualRange(20, 5, 120, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {20, 25, 120, "foo"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 5, "translate me", map_, false,
                                            &map3_));

  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"}
  });

  map_.AddDualRange(1000, 30, 1100, "bar");
  ASSERT_TRUE(map2_.AddRangeWithTranslation(1000, 5, "translate me2", map_,
                                            false, &map3_));
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {1000, 1005, kNoTranslation, "translate me2"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {1100, 1105, kNoTranslation, "translate me2"}
  });

  // Starts before base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(15, 8, "translate me", map_, false,
                                             &map3_));

  // Extends past base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(22, 15, "translate me", map_,
                                             false, &map3_));

  // Starts and ends in base map, but skips range in the middle.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(20, 1000, "translate me", map_,
                                             false, &map3_));
}